

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMDetector.cpp
# Opt level: O1

DetectorResults *
ZXing::DataMatrix::Detect
          (DetectorResults *__return_storage_ptr__,BitMatrix *image,bool tryHarder,bool tryRotate,
          bool isPure)

{
  PointT<int> PVar1;
  _Rb_tree_node_base *p_Var2;
  undefined4 uVar3;
  undefined4 uVar4;
  void *pvVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  pointer pPVar9;
  ResultPoint *pRVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  _Rb_tree_node_base *p_Var13;
  undefined4 uVar14;
  DetectorResults *pDVar15;
  undefined8 uVar16;
  pointer puVar17;
  pointer puVar18;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar19;
  bool bVar20;
  bool bVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  long lVar26;
  pointer *ppPVar27;
  mapped_type *pmVar28;
  _Rb_tree_node_base *p_Var29;
  PointF **ppPVar30;
  _Rb_tree_node_base *p_Var31;
  EdgeTracer *pEVar32;
  undefined4 uVar33;
  uint uVar34;
  undefined7 in_register_00000009;
  value_t_conflict *pvVar35;
  PointT<int> PVar36;
  undefined7 in_register_00000011;
  EdgeTracer *from;
  int iVar37;
  RegressionLine *pRVar38;
  ResultPointsAndTransitions *pRVar39;
  PointF *pPVar40;
  PointF *pPVar41;
  size_t __n;
  PointF *pPVar42;
  uint uVar43;
  long lVar44;
  ResultPointsAndTransitions *pRVar45;
  PointT<int> PVar46;
  PointF *pPVar47;
  PointT<int> PVar48;
  double dVar49;
  _Base_ptr extraout_XMM0_Qb;
  undefined1 auVar50 [16];
  double dVar57;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  _Base_ptr extraout_XMM0_Qb_00;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  float fVar58;
  double dVar59;
  float fVar64;
  float fVar65;
  uint uVar66;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  uint uVar67;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar68;
  _Base_ptr p_Var69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  _Base_ptr p_Var73;
  ulong uVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  PointF dEdge;
  PointF dir;
  PointF dEdge_00;
  PointF dir_00;
  PointF dEdge_01;
  PointF dir_01;
  PointF dEdge_02;
  PointF dEdge_03;
  PointF dir_02;
  PointF dEdge_04;
  PointT<double> PVar79;
  PointF tr;
  ResultPoint *topLeft;
  PointF br;
  PointF bl;
  PointF tl;
  int height;
  int width;
  BitMatrixCursorI cur;
  ResultPoint pointA;
  int top;
  int left;
  array<ZXing::DataMatrix::DMRegressionLine,_4UL> lines;
  undefined1 local_3d8 [16];
  PointF local_3c8;
  DetectorResults *local_3b0;
  PointF *local_3a8;
  uint local_39c;
  undefined1 local_398 [24];
  double dStack_380;
  undefined1 local_378 [32];
  undefined1 local_358 [16];
  _Rb_tree_node_base *local_348;
  PointT<double> PStack_340;
  ByteMatrix *pBStack_330;
  int local_328;
  undefined4 uStack_324;
  double local_318;
  undefined4 local_30c;
  DetectorResult local_308;
  _Base_ptr local_2c8;
  _Base_ptr p_Stack_2c0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_2b0;
  PerspectiveTransform local_2a8;
  PointT<double> local_258;
  _Base_ptr local_248;
  _Base_ptr p_Stack_240;
  EdgeTracer local_238;
  QuadrilateralF local_1f8;
  QuadrilateralF local_1b8;
  EdgeTracer local_178;
  double local_140;
  undefined1 local_138 [32];
  key_type pRStack_118;
  int local_110;
  undefined4 uStack_10c;
  undefined1 local_108 [24];
  ResultPointsAndTransitions local_f0;
  double local_d0;
  double local_c8;
  double dStack_c0;
  RegressionLine local_b8;
  RegressionLine local_78;
  
  local_30c = (undefined4)CONCAT71(in_register_00000009,tryRotate);
  uVar74 = CONCAT71(in_register_00000011,tryHarder) & 0xffffffff;
  bVar20 = BitMatrix::findBoundingBox
                     (image,(int *)&local_1b8,(int *)&local_1f8,(int *)&local_308,(int *)local_358,8
                     );
  local_3b0 = __return_storage_ptr__;
  if (bVar20) {
    local_2a8.a12 =
         (value_t)CONCAT44(local_1f8.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].x._0_4_,
                           local_1b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].x._0_4_);
    local_2a8.a13 = 2.12199579096527e-314;
    iVar37 = local_358._0_4_ + -1;
    uVar43 = 1;
    local_2a8.a11 = (value_t)image;
    do {
      iVar22 = 0;
      if (iVar37 != 0) {
        iVar22 = BitMatrixCursor<ZXing::PointT<int>_>::stepToEdge
                           ((BitMatrixCursor<ZXing::PointT<int>_> *)&local_2a8,1,iVar37,false);
      }
      iVar37 = iVar37 - iVar22;
      uVar43 = uVar43 - 1;
    } while (iVar22 != 0);
    if ((iVar22 != 0) == uVar43) {
      local_2a8.a13 = (value_t)CONCAT44(-local_2a8.a13._0_4_,local_2a8.a13._4_4_);
      iVar37 = local_308._bits._width + -1;
      uVar43 = 1;
      do {
        iVar22 = 0;
        if (iVar37 != 0) {
          iVar22 = BitMatrixCursor<ZXing::PointT<int>_>::stepToEdge
                             ((BitMatrixCursor<ZXing::PointT<int>_> *)&local_2a8,1,iVar37,false);
        }
        iVar37 = iVar37 - iVar22;
        uVar43 = uVar43 - 1;
      } while (iVar22 != 0);
      if ((iVar22 != 0) == uVar43) {
        local_39c = (uint)CONCAT71(in_register_00000011,tryHarder);
        local_2a8.a13 = (value_t)CONCAT44(-local_2a8.a13._0_4_,local_2a8.a13._4_4_);
        iVar22 = local_358._0_4_ + -1;
        iVar37 = -1;
        do {
          iVar24 = iVar37;
          iVar23 = 0;
          if (iVar22 != 0) {
            iVar23 = BitMatrixCursor<ZXing::PointT<int>_>::stepToEdge
                               ((BitMatrixCursor<ZXing::PointT<int>_> *)&local_2a8,1,iVar22,false);
          }
          iVar22 = iVar22 - iVar23;
          iVar37 = iVar24 + 1;
        } while (iVar23 != 0);
        local_2a8.a13 = (value_t)CONCAT44(-local_2a8.a13._0_4_,local_2a8.a13._4_4_);
        iVar22 = local_308._bits._width + -1;
        iVar37 = -1;
        do {
          iVar25 = iVar37;
          iVar23 = 0;
          if (iVar22 != 0) {
            iVar23 = BitMatrixCursor<ZXing::PointT<int>_>::stepToEdge
                               ((BitMatrixCursor<ZXing::PointT<int>_> *)&local_2a8,1,iVar22,false);
          }
          iVar22 = iVar22 - iVar23;
          iVar37 = iVar25 + 1;
        } while (iVar23 != 0);
        if (((((iVar25 + 1U & 1) != 0) && (0xffffff76 < iVar24 - 0x8fU)) && ((iVar24 + 1U & 1) != 0)
            ) && (0xffffff78 < iVar25 - 0x8fU)) {
          fVar58 = (float)local_308._bits._width / (float)(iVar25 + 2);
          fVar64 = (float)(int)local_358._0_4_ / (float)(iVar24 + 2);
          if (ABS(fVar58 - fVar64) <= 1.0) {
            fVar65 = (fVar58 + fVar64) * 0.5;
            fVar68 = (float)(int)(iVar25 + 1U) * fVar65 +
                     fVar58 * 0.5 +
                     (float)local_1b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].x._0_4_;
            if ((0.0 <= fVar68) && (fVar68 < (float)image->_width)) {
              fVar68 = (float)(int)(iVar24 + 1U) * fVar65 +
                       fVar64 * 0.5 +
                       (float)local_1f8.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].x._0_4_;
              if ((0.0 <= fVar68) && (fVar68 < (float)image->_height)) {
                PVar46.x = local_308._bits._width +
                           local_1b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].x._0_4_ +
                           -1;
                iVar37 = local_358._0_4_ + -1 +
                         local_1f8.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].x._0_4_;
                Deflate((BitMatrix *)local_138,image,iVar25 + 2,iVar24 + 2,
                        fVar58 * 0.5 +
                        (float)local_1f8.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].x._0_4_
                        ,fVar64 * 0.5 +
                         (float)local_1b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].x.
                                _0_4_,fVar65);
                PVar1.y = local_1f8.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].x._0_4_;
                PVar1.x = local_1b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].x._0_4_;
                PVar36.y = local_1f8.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].x._0_4_;
                PVar36.x = PVar46.x;
                PVar46.y = iVar37;
                PVar48.y = iVar37;
                PVar48.x = local_1b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].x._0_4_;
                (local_3b0->_bits)._width = local_138._0_4_;
                (local_3b0->_bits)._height = local_138._4_4_;
                (local_3b0->_bits)._bits.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)local_138._8_8_;
                (local_3b0->_bits)._bits.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)local_138._16_8_;
                (local_3b0->_bits)._bits.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)local_138._24_8_;
                local_138._8_8_ = (RegressionLine *)0x0;
                local_138._16_8_ = (RegressionLine *)0x0;
                local_138._24_8_ = (pointer)0x0;
                (local_3b0->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0] = PVar1;
                (local_3b0->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1] = PVar36;
                (local_3b0->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2] = PVar46;
                (local_3b0->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3] = PVar48;
                uVar74 = (ulong)local_39c;
                goto LAB_001513c9;
              }
            }
          }
        }
        (local_3b0->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = 0;
        (local_3b0->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = 0;
        (local_3b0->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x = 0;
        (local_3b0->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y = 0;
        (local_3b0->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = 0;
        (local_3b0->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = 0;
        (local_3b0->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = 0;
        (local_3b0->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = 0;
        (local_3b0->_bits)._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (local_3b0->_bits)._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (local_3b0->_bits)._width = 0;
        (local_3b0->_bits)._height = 0;
        (local_3b0->_bits)._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        uVar74 = (ulong)local_39c;
        goto LAB_001513c9;
      }
    }
    (local_3b0->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = 0;
    (local_3b0->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = 0;
    (local_3b0->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x = 0;
    (local_3b0->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y = 0;
    (local_3b0->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = 0;
    (local_3b0->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = 0;
    (local_3b0->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = 0;
    (local_3b0->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = 0;
    (local_3b0->_bits)._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_3b0->_bits)._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_3b0->_bits)._width = 0;
    (local_3b0->_bits)._height = 0;
    (local_3b0->_bits)._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  }
  else {
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = 0;
    (__return_storage_ptr__->_bits)._bits.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->_bits)._bits.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->_bits)._width = 0;
    (__return_storage_ptr__->_bits)._height = 0;
    (__return_storage_ptr__->_bits)._bits.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
  }
LAB_001513c9:
  local_2b0 = &(local_3b0->_bits)._bits;
  if ((local_3b0->_bits)._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (local_3b0->_bits)._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish && !isPure) {
    local_39c = (uint)uVar74;
    lVar44 = 0;
    do {
      RegressionLine::RegressionLine((RegressionLine *)(local_138 + lVar44));
      lVar44 = lVar44 + 0x40;
    } while (lVar44 != 0x100);
    lVar44 = 0;
    do {
      local_238.super_BitMatrixCursorF.d = (PointT<double>)ZEXT816(0);
      local_238.history = (ByteMatrix *)0x0;
      local_238.state = 0;
      uVar33 = 0x195a20;
      dVar57 = *(double *)*(undefined1 (*) [16])(&DAT_00195a20 + lVar44);
      auVar63 = *(undefined1 (*) [16])(&DAT_00195a20 + lVar44);
      uVar3 = image->_width;
      uVar4 = image->_height;
      local_258.x._4_4_ = uVar4;
      local_258.x._0_4_ = uVar3;
      local_258.y = 0.0;
      local_248 = (_Base_ptr)
                  (dVar57 * 8.0 + ((double)((int)uVar3 / 2) - dVar57 * (double)((int)uVar3 / 2)));
      p_Stack_240 = (_Base_ptr)
                    (*(double *)(&UNK_00195a28 + lVar44) * 8.0 +
                    ((double)((int)uVar4 / 2) -
                    *(double *)(&UNK_00195a28 + lVar44) * (double)((int)uVar4 / 2)));
      local_238.super_BitMatrixCursorF.img = image;
      local_2c8 = (_Base_ptr)floor((double)local_248);
      p_Stack_2c0 = extraout_XMM0_Qb;
      dVar49 = floor((double)p_Stack_240);
      auVar50 = auVar63 & _DAT_001942a0;
      dVar57 = auVar50._8_8_;
      dVar59 = auVar50._0_8_;
      if (dVar57 <= dVar59) {
        dVar57 = dVar59;
      }
      auVar50._8_8_ = dVar57;
      auVar50._0_8_ = dVar57;
      local_238.super_BitMatrixCursorF.d = (PointT<double>)divpd(auVar63,auVar50);
      dVar57 = dVar49 + 0.5 + local_238.super_BitMatrixCursorF.d.x * 0.0;
      dVar49 = ((double)local_2c8 + 0.5) - local_238.super_BitMatrixCursorF.d.y * 0.0;
      local_238.super_BitMatrixCursorF.p.y = dVar57;
      local_238.super_BitMatrixCursorF.p.x = dVar49;
      bVar20 = true;
      if ((0.0 <= dVar49) &&
         (auVar63._8_8_ = -(ulong)(dVar57 < (double)local_258.x._4_4_),
         auVar63._0_8_ = -(ulong)(dVar49 < (double)local_258.x._0_4_),
         uVar33 = movmskpd(uVar33,auVar63),
         (byte)(0.0 <= dVar57 & (byte)uVar33 & (byte)uVar33 >> 1) != 0)) {
        bVar21 = EdgeTracer::moveToNextWhiteAfterBlack(&local_238);
        while (bVar21 != false) {
          local_378._0_16_ = ZEXT816(0);
          stack0xfffffffffffffc78 = (PointF)ZEXT816(0);
          local_398._0_16_ = ZEXT816(0);
          local_3c8 = (PointF)ZEXT816(0);
          lVar26 = 0;
          do {
            if (*(long *)(local_138 + lVar26 + 8) != *(long *)(local_138 + lVar26)) {
              *(long *)(local_138 + lVar26 + 8) = *(long *)(local_138 + lVar26);
            }
            *(undefined8 *)(local_138 + lVar26 + 0x18) = 0;
            *(undefined8 *)((long)&pRStack_118 + lVar26) = 0;
            *(undefined8 *)(local_108 + lVar26 + 8) = 0x7ff8000000000000;
            *(undefined8 *)((long)&local_110 + lVar26) = 0x7ff8000000000000;
            *(undefined8 *)(local_108 + lVar26) = 0x7ff8000000000000;
            lVar26 = lVar26 + 0x40;
          } while (lVar26 != 0x100);
          pBStack_330 = local_238.history;
          local_348 = (_Rb_tree_node_base *)local_238.super_BitMatrixCursorF.p.y;
          local_358._0_8_ = local_238.super_BitMatrixCursorF.img;
          local_358._8_8_ = local_238.super_BitMatrixCursorF.p.x;
          dEdge.y = (double)((ulong)local_238.super_BitMatrixCursorF.d.y ^ (ulong)DAT_001942b0);
          PStack_340.y = local_238.super_BitMatrixCursorF.d.x;
          PStack_340.x = dEdge.y;
          uStack_324 = local_238._52_4_;
          local_328 = 1;
          dEdge.x = (double)((ulong)local_238.super_BitMatrixCursorF.d.x ^ (ulong)DAT_001942b0);
          bVar21 = EdgeTracer::traceLine((EdgeTracer *)local_358,dEdge,(RegressionLine *)local_138);
          if (bVar21) {
            dir.x = -PStack_340.y;
            dir.y = PStack_340.x;
            bVar21 = EdgeTracer::traceCorner((EdgeTracer *)local_358,dir,(PointF *)local_378);
            if (bVar21) {
              pvVar35 = &((RegressionLine *)(local_138._8_8_ + -0x40))->b;
              pRVar38 = (RegressionLine *)local_138._0_8_;
              if ((ulong)local_138._0_8_ < pvVar35 && local_138._0_8_ != local_138._8_8_) {
                do {
                  ppPVar27 = &(pRVar38->_points).
                              super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  local_2a8.a11 =
                       (value_t)(pRVar38->_points).
                                super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                  local_2a8.a12 =
                       (value_t)(pRVar38->_points).
                                super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
                  pPVar9 = (pointer)pvVar35[1];
                  (pRVar38->_points).
                  super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)*pvVar35;
                  (pRVar38->_points).
                  super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = pPVar9;
                  *pvVar35 = local_2a8.a11;
                  pvVar35[1] = local_2a8.a12;
                  pvVar35 = pvVar35 + -2;
                  pRVar38 = (RegressionLine *)ppPVar27;
                } while (ppPVar27 < pvVar35);
              }
              local_178.history = pBStack_330;
              local_178.super_BitMatrixCursorF.p.y = (double)local_348;
              local_178.super_BitMatrixCursorF.d = PStack_340;
              local_178.state = local_328;
              local_178._52_4_ = uStack_324;
              local_178.super_BitMatrixCursorF.img = (BitMatrix *)local_358._0_8_;
              local_178.super_BitMatrixCursorF.p.x = (double)local_358._8_8_;
              local_348 = (_Rb_tree_node_base *)local_238.super_BitMatrixCursorF.p.y;
              pBStack_330 = local_238.history;
              local_358._0_8_ = local_238.super_BitMatrixCursorF.img;
              local_358._8_8_ = local_238.super_BitMatrixCursorF.p.x;
              local_328 = 1;
              auVar51._0_8_ = (ulong)PStack_340.y ^ (ulong)DAT_001942b0;
              PStack_340.y = (double)((ulong)PStack_340.y & (ulong)DAT_001942a0);
              auVar51._8_8_ = PStack_340.x;
              PStack_340.x = (double)((ulong)PStack_340.x & (ulong)DAT_001942a0);
              if (PStack_340.x <= PStack_340.y) {
                PStack_340.x = PStack_340.y;
              }
              auVar70._8_8_ = PStack_340.x;
              auVar70._0_8_ = PStack_340.x;
              PStack_340 = (PointT<double>)divpd(auVar51,auVar70);
              dEdge_00.y = (double)((ulong)PStack_340.x ^ (ulong)DAT_001942b0);
              dEdge_00.x = PStack_340.y;
              bVar21 = EdgeTracer::traceLine
                                 ((EdgeTracer *)local_358,dEdge_00,(RegressionLine *)local_138);
              if (bVar21) {
                bVar21 = DMRegressionLine::truncateIfLShape((DMRegressionLine *)local_138);
                if (bVar21) {
                  local_358._8_8_ = ((RegressionLine *)(local_138._8_8_ + -0x40))->b;
                  local_348 = (_Rb_tree_node_base *)((RegressionLine *)(local_138._8_8_ + -0x40))->c
                  ;
                }
                EdgeTracer::updateDirectionFromOrigin
                          ((EdgeTracer *)local_358,(PointF)local_378._0_16_);
                dir_00.y = -PStack_340.x;
                local_2c8 = (_Base_ptr)PStack_340.x;
                p_Stack_2c0 = (_Base_ptr)PStack_340.y;
                local_248 = (_Base_ptr)PStack_340.y;
                p_Stack_240 = (_Base_ptr)PStack_340.y;
                local_3d8._8_8_ = -PStack_340.y;
                local_3d8._0_8_ = dir_00.y;
                dir_00.x = PStack_340.y;
                bVar21 = EdgeTracer::traceCorner
                                   ((EdgeTracer *)local_358,dir_00,(PointF *)(local_398 + 0x10));
                if (bVar21) {
                  local_328 = 2;
                  dEdge_01.y = -PStack_340.x;
                  dEdge_01.x = PStack_340.y;
                  bVar21 = EdgeTracer::traceLine
                                     ((EdgeTracer *)local_358,dEdge_01,
                                      (RegressionLine *)(local_108 + 0x10));
                  if (bVar21) {
                    EdgeTracer::updateDirectionFromOrigin
                              ((EdgeTracer *)local_358,stack0xfffffffffffffc78);
                    dir_01.y = -PStack_340.x;
                    local_258 = PStack_340;
                    dir_01.x = PStack_340.y;
                    bVar21 = EdgeTracer::traceCorner
                                       ((EdgeTracer *)local_358,dir_01,(PointF *)local_398);
                    if (bVar21) {
                      dVar57 = ((double)local_378._0_8_ - (double)local_398._16_8_) *
                               ((double)local_378._0_8_ - (double)local_398._16_8_) +
                               ((double)local_378._8_8_ - dStack_380) *
                               ((double)local_378._8_8_ - dStack_380);
                      if (dVar57 < 0.0) {
                        dVar57 = sqrt(dVar57);
                      }
                      else {
                        dVar57 = SQRT(dVar57);
                      }
                      local_378._16_8_ = dVar57 + -1.0;
                      dVar57 = ((double)local_398._16_8_ - (double)local_398._0_8_) *
                               ((double)local_398._16_8_ - (double)local_398._0_8_) +
                               (dStack_380 - (double)local_398._8_8_) *
                               (dStack_380 - (double)local_398._8_8_);
                      if (dVar57 < 0.0) {
                        dVar57 = sqrt(dVar57);
                      }
                      else {
                        dVar57 = SQRT(dVar57);
                      }
                      dVar57 = dVar57 + -1.0;
                      if ((((dVar57 <= (double)local_378._16_8_ * 18.0) &&
                           ((double)local_378._16_8_ * 0.25 <= dVar57)) &&
                          (8.0 <= (double)local_378._16_8_)) && (10.0 <= dVar57)) {
                        dVar49 = SUB168((undefined1  [16])local_258 & _DAT_001942a0,8);
                        dVar59 = SUB168((undefined1  [16])local_258 & _DAT_001942a0,0);
                        if (dVar49 <= dVar59) {
                          dVar49 = dVar59;
                        }
                        auVar60._8_8_ = dVar49;
                        auVar60._0_8_ = dVar49;
                        local_258 = (PointT<double>)divpd((undefined1  [16])local_258,auVar60);
                        local_318 = dVar57;
                        local_178.super_BitMatrixCursorF.d = local_258;
                        RegressionLine::RegressionLine((RegressionLine *)&local_2a8);
                        dEdge_02.y = local_258.x;
                        dEdge_02.x = -local_258.y;
                        bVar21 = EdgeTracer::traceGaps
                                           (&local_178,dEdge_02,&local_78,
                                            (int)(local_318 / 5.0 + 1.0),
                                            (RegressionLine *)&local_2a8,local_318 * 0.5);
                        if ((RegressionLine *)local_2a8.a11 != (RegressionLine *)0x0) {
                          operator_delete((void *)local_2a8.a11,
                                          (long)local_2a8.a13 - (long)local_2a8.a11);
                        }
                        if (bVar21) {
                          iVar37 = 0;
                          if (0x10 < (ulong)((long)local_78._points.
                                                                                                      
                                                  super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)local_78._points.
                                                  super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)) {
                            dVar57 = (local_78._points.
                                      super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->x -
                                     local_78._points.
                                     super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish[-1].x;
                            dVar49 = (local_78._points.
                                      super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->y -
                                     local_78._points.
                                     super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish[-1].y;
                            dVar57 = dVar57 * dVar57 + dVar49 * dVar49;
                            if (dVar57 < 0.0) {
                              dVar57 = sqrt(dVar57);
                            }
                            else {
                              dVar57 = SQRT(dVar57);
                            }
                            iVar37 = (int)dVar57 / 3;
                          }
                          iVar22 = (int)((double)local_378._16_8_ / 5.0);
                          if (iVar37 < (int)((double)local_378._16_8_ / 5.0)) {
                            iVar22 = iVar37;
                          }
                          dVar57 = ABS((double)local_248);
                          if (ABS((double)local_248) <= ABS((double)local_2c8)) {
                            dVar57 = ABS((double)local_2c8);
                          }
                          auVar71._8_8_ = dVar57;
                          auVar71._0_8_ = dVar57;
                          PStack_340 = (PointT<double>)divpd(local_3d8,auVar71);
                          local_328 = 3;
                          dEdge_03.y = -PStack_340.x;
                          dEdge_03.x = PStack_340.y;
                          bVar21 = EdgeTracer::traceGaps
                                             ((EdgeTracer *)local_358,dEdge_03,&local_b8,iVar22 * 2,
                                              &local_78,0.0);
                          if (bVar21) {
                            dir_02.y = -PStack_340.x;
                            dir_02.x = PStack_340.y;
                            bVar21 = EdgeTracer::traceCorner
                                               ((EdgeTracer *)local_358,dir_02,&local_3c8);
                            if (bVar21) {
                              dVar57 = ((double)local_378._0_8_ - local_3c8.x) *
                                       ((double)local_378._0_8_ - local_3c8.x) +
                                       ((double)local_378._8_8_ - local_3c8.y) *
                                       ((double)local_378._8_8_ - local_3c8.y);
                              if (dVar57 < 0.0) {
                                dVar57 = sqrt(dVar57);
                              }
                              else {
                                dVar57 = SQRT(dVar57);
                              }
                              dVar49 = (local_3c8.x - (double)local_398._0_8_) *
                                       (local_3c8.x - (double)local_398._0_8_) +
                                       (local_3c8.y - (double)local_398._8_8_) *
                                       (local_3c8.y - (double)local_398._8_8_);
                              if (dVar49 < 0.0) {
                                dVar49 = sqrt(dVar49);
                              }
                              else {
                                dVar49 = SQRT(dVar49);
                              }
                              if (((ABS((dVar57 + -1.0) - local_318) / local_318 < 0.5) &&
                                  (ABS((dVar49 + -1.0) - (double)local_378._16_8_) /
                                   (double)local_378._16_8_ < 0.5)) &&
                                 ((0x40 < (ulong)((long)local_78._points.
                                                                                                                
                                                  super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                 (long)local_78._points.
                                                                                                              
                                                  super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) &&
                                  (0x40 < (ulong)((long)local_b8._points.
                                                                                                                
                                                  super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                 (long)local_b8._points.
                                                                                                              
                                                  super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start))))) {
                                dEdge_04.x = -local_178.super_BitMatrixCursorF.d.y;
                                dEdge_04.y = local_178.super_BitMatrixCursorF.d.x;
                                bVar21 = EdgeTracer::traceGaps
                                                   (&local_178,dEdge_04,&local_78,iVar22 * 2,
                                                    &local_b8,0.0);
                                if (bVar21) {
                                  local_2a8.a11 = (value_t)local_138;
                                  local_2a8.a12 = (value_t)(local_108 + 0x10);
                                  local_2a8.a13 = (value_t)&local_78;
                                  local_2a8.a21 = (value_t)&local_b8;
                                  lVar26 = 0;
                                  do {
                                    RegressionLine::evaluate
                                              (*(RegressionLine **)((long)&local_2a8.a11 + lVar26),
                                               1.0,false);
                                    lVar26 = lVar26 + 8;
                                  } while (lVar26 != 0x20);
                                  dVar49 = (double)CONCAT44(uStack_10c,local_110);
                                  dVar57 = local_d0 * (double)local_108._0_8_ + dVar49 * -local_c8;
                                  auVar78._0_8_ =
                                       dStack_c0 * (double)local_108._0_8_ -
                                       (double)local_108._8_8_ * local_c8;
                                  auVar78._8_8_ =
                                       local_d0 * (double)local_108._8_8_ - dVar49 * dStack_c0;
                                  auVar6._8_4_ = SUB84(dVar57,0);
                                  auVar6._0_8_ = dVar57;
                                  auVar6._12_4_ = (int)((ulong)dVar57 >> 0x20);
                                  register0x00001480 = (PointF)divpd(auVar78,auVar6);
                                  dVar57 = local_78.a * (double)local_108._0_8_ +
                                           dVar49 * -local_78.b;
                                  auVar52._0_8_ =
                                       (double)local_108._0_8_ * local_78.c -
                                       (double)local_108._8_8_ * local_78.b;
                                  auVar52._8_8_ =
                                       (double)local_108._8_8_ * local_78.a - dVar49 * local_78.c;
                                  auVar8._8_8_ = dVar57;
                                  auVar8._0_8_ = dVar57;
                                  local_378._0_16_ = divpd(auVar52,auVar8);
                                  dVar57 = local_78.a * local_b8.b + -local_78.b * local_b8.a;
                                  auVar72._0_8_ = local_78.c * local_b8.b - local_78.b * local_b8.c;
                                  auVar72._8_8_ = local_78.a * local_b8.c - local_78.c * local_b8.a;
                                  auVar7._8_8_ = dVar57;
                                  auVar7._0_8_ = dVar57;
                                  local_3c8 = (PointF)divpd(auVar72,auVar7);
                                  auVar61._0_8_ = local_d0 * local_b8.b + -local_c8 * local_b8.a;
                                  auVar75._0_8_ = dStack_c0 * local_b8.b - local_b8.c * local_c8;
                                  auVar75._8_8_ = local_d0 * local_b8.c - local_b8.a * dStack_c0;
                                  auVar61._8_8_ = auVar61._0_8_;
                                  local_398._0_16_ = divpd(auVar75,auVar61);
                                  dVar57 = DMRegressionLine::modules
                                                     ((DMRegressionLine *)&local_78,
                                                      (PointF)local_378._0_16_,local_3c8);
                                  pRVar38 = &local_b8;
                                  auVar53._0_8_ =
                                       DMRegressionLine::modules
                                                 ((DMRegressionLine *)pRVar38,
                                                  (PointF)local_398._0_16_,local_3c8);
                                  auVar53._8_8_ = dVar57;
                                  uVar34 = (uint)((ulong)(SUB168(auVar53 & _DAT_001942a0,0) +
                                                         -0x10000000000000) >> 0x20);
                                  uVar67 = (uint)((ulong)(SUB168(auVar53 & _DAT_001942a0,8) +
                                                         -0x10000000000000) >> 0x20);
                                  uVar43 = uVar34 ^ 0x80000000;
                                  uVar66 = uVar67 ^ 0x80000000;
                                  auVar62._0_4_ = -(uint)(-0x200001 < (int)uVar43);
                                  auVar62._4_4_ = -(uint)(-0x200001 < (int)(uVar34 ^ 0x80000000));
                                  auVar62._8_4_ = -(uint)(-0x200001 < (int)uVar66);
                                  auVar62._12_4_ = -(uint)(-0x200001 < (int)(uVar67 ^ 0x80000000));
                                  uVar74 = CONCAT44((int)(dVar57 + 0.5),(int)(auVar53._0_8_ + 0.5))
                                           & CONCAT44(-(uint)((int)uVar66 < -0x200000),
                                                      -(uint)((int)uVar43 < -0x200000));
                                  iVar37 = (int)uVar74;
                                  iVar22 = (int)(uVar74 >> 0x20);
                                  auVar54._0_8_ =
                                       (ulong)(auVar53._0_8_ - (double)iVar37) & (ulong)DAT_001942a0
                                  ;
                                  auVar54._8_8_ =
                                       (ulong)(dVar57 - (double)iVar22) & DAT_001942a0._8_8_;
                                  iVar22 = iVar22 * 2;
                                  uVar34 = iVar22 + iVar37 * -2;
                                  uVar43 = -uVar34;
                                  if (0 < (int)uVar34) {
                                    uVar43 = uVar34;
                                  }
                                  auVar63 = auVar62 & _DAT_00195960 | ~auVar62 & auVar54;
                                  iVar23 = iVar22;
                                  if (auVar63._0_8_ < auVar63._8_8_) {
                                    iVar23 = iVar37 * 2;
                                  }
                                  iVar24 = iVar23;
                                  if (9 < uVar43) {
                                    iVar23 = iVar37 * 2;
                                    iVar24 = iVar22;
                                  }
                                  if ((iVar24 - 10U < 0x87) && (iVar23 - 8U < 0x89)) {
                                    PVar79 = Scan(ZXing::DataMatrix::EdgeTracer&,std::array<ZXing::DataMatrix::DMRegressionLine,4ul>&)
                                             ::$_0::operator()((__0 *)pRVar38,
                                                               (PointF)local_378._0_16_,local_3c8,
                                                               stack0xfffffffffffffc78,0.5);
                                    local_248 = (_Base_ptr)PVar79.y;
                                    local_2c8 = (_Base_ptr)PVar79.x;
                                    PVar79 = Scan(ZXing::DataMatrix::EdgeTracer&,std::array<ZXing::DataMatrix::DMRegressionLine,4ul>&)
                                             ::$_0::operator()((__0 *)pRVar38,local_3c8,
                                                               (PointF)local_398._0_16_,
                                                               (PointF)local_378._0_16_,0.3);
                                    local_378._16_8_ = PVar79.y;
                                    local_258.x = PVar79.x;
                                    PVar79 = Scan(ZXing::DataMatrix::EdgeTracer&,std::array<ZXing::DataMatrix::DMRegressionLine,4ul>&)
                                             ::$_0::operator()((__0 *)pRVar38,
                                                               (PointF)local_398._0_16_,
                                                               stack0xfffffffffffffc78,local_3c8,0.5
                                                              );
                                    local_140 = PVar79.y;
                                    local_318 = PVar79.x;
                                    local_1b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[3] =
                                         Scan(ZXing::DataMatrix::EdgeTracer&,std::array<ZXing::DataMatrix::DMRegressionLine,4ul>&)
                                         ::$_0::operator()((__0 *)pRVar38,stack0xfffffffffffffc78,
                                                           (PointF)local_378._0_16_,
                                                           (PointF)local_398._0_16_,0.5);
                                    local_1b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].x
                                         = (double)local_2c8;
                                    local_1b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].y
                                         = (double)local_248;
                                    local_1b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].x
                                         = local_258.x;
                                    local_1b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].y
                                         = (double)local_378._16_8_;
                                    local_1b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[2].x
                                         = local_318;
                                    local_1b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[2].y
                                         = local_140;
                                    local_1f8.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].x
                                         = (double)iVar24;
                                    local_1f8.super_array<ZXing::PointT<double>,_4UL>._M_elems[2].y
                                         = (double)iVar23;
                                    local_2c8 = (_Base_ptr)local_238.super_BitMatrixCursorF.img;
                                    local_1f8.super_array<ZXing::PointT<double>,_4UL>._M_elems[0] =
                                         (PointT<double>)ZEXT816(0);
                                    local_1f8.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].y
                                         = 0.0;
                                    local_1f8.super_array<ZXing::PointT<double>,_4UL>._M_elems[3].x
                                         = 0.0;
                                    local_1f8.super_array<ZXing::PointT<double>,_4UL>._M_elems[2].x
                                         = local_1f8.super_array<ZXing::PointT<double>,_4UL>.
                                           _M_elems[1].x;
                                    local_1f8.super_array<ZXing::PointT<double>,_4UL>._M_elems[3].y
                                         = local_1f8.super_array<ZXing::PointT<double>,_4UL>.
                                           _M_elems[2].y;
                                    PerspectiveTransform::PerspectiveTransform
                                              (&local_2a8,&local_1f8,&local_1b8);
                                    SampleGrid(&local_308,(BitMatrix *)local_2c8,iVar24,iVar23,
                                               &local_2a8);
                                    puVar18 = local_308._bits._bits.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_finish;
                                    puVar17 = local_308._bits._bits.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_start;
                                    if (local_308._bits._bits.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0 &&
                                        local_308._bits._bits.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start ==
                                        local_308._bits._bits.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish) {
                                      operator_delete(local_308._bits._bits.
                                                                                                            
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_308._bits._bits.
                                                                                                                
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_308._bits._bits.
                                                                                                                    
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                    }
                                    if (puVar17 != puVar18) goto LAB_001522d7;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          bVar21 = EdgeTracer::moveToNextWhiteAfterBlack(&local_238);
        }
        local_308._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = 0;
        local_308._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = 0;
        local_308._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x = 0;
        local_308._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y = 0;
        local_308._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = 0;
        local_308._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = 0;
        local_308._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = 0;
        local_308._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = 0;
        local_308._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_308._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_308._bits._width = 0;
        local_308._bits._height = 0;
        local_308._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
LAB_001522d7:
        if (local_308._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            local_308._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          if (local_308._bits._bits.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_308._bits._bits.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_308._bits._bits.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_308._bits._bits.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
        }
        else {
          bVar20 = false;
        }
      }
      pvVar19 = local_2b0;
      if ((!bVar20) || ((byte)local_30c == 0)) {
        if ((bVar20 & ((byte)local_30c ^ 1)) != 1) goto LAB_00152357;
        break;
      }
      lVar44 = lVar44 + 0x10;
    } while (lVar44 != 0x40);
    local_308._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = 0;
    local_308._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = 0;
    local_308._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x = 0;
    local_308._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y = 0;
    local_308._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = 0;
    local_308._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = 0;
    local_308._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = 0;
    local_308._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = 0;
    local_308._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_308._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_308._bits._width = 0;
    local_308._bits._height = 0;
    local_308._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
LAB_00152357:
    lVar44 = 0xc0;
    uVar74 = (ulong)local_39c;
    do {
      pvVar5 = *(void **)(local_138 + lVar44);
      if (pvVar5 != (void *)0x0) {
        operator_delete(pvVar5,*(long *)(local_138 + lVar44 + 0x10) - (long)pvVar5);
      }
      pDVar15 = local_3b0;
      lVar44 = lVar44 + -0x40;
    } while (lVar44 != -0x40);
    (local_3b0->_bits)._width = local_308._bits._width;
    (local_3b0->_bits)._height = local_308._bits._height;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              (pvVar19,&local_308._bits._bits);
    auVar11._8_4_ = local_308._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x;
    auVar11._12_4_ = local_308._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y;
    auVar11._0_4_ = local_308._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x;
    auVar11._4_4_ = local_308._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y;
    *(undefined1 (*) [16])((pDVar15->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems + 2) =
         auVar11;
    (pDVar15->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0] =
         local_308._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[0];
    (pDVar15->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1] =
         local_308._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[1];
    if (local_308._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_308._bits._bits.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_308._bits._bits.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_308._bits._bits.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (((char)uVar74 != '\x01' || isPure) ||
      (local_3b0->_bits)._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (local_3b0->_bits)._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    return local_3b0;
  }
  local_238.super_BitMatrixCursorF.img = (BitMatrix *)0x0;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_238.super_BitMatrixCursorF.p.y;
  local_238.super_BitMatrixCursorF.p = (PointT<double>)(auVar12 << 0x40);
  local_378._0_16_ = ZEXT816(0);
  stack0xfffffffffffffc78 = (PointF)ZEXT816(0);
  local_398._0_16_ = ZEXT816(0);
  bVar20 = DetectWhiteRect(image,(ResultPoint *)&local_238,(ResultPoint *)local_378,
                           (ResultPoint *)(local_398 + 0x10),(ResultPoint *)local_398);
  if (bVar20) {
    TransitionsBetween((ResultPointsAndTransitions *)local_138,image,(ResultPoint *)&local_238,
                       (ResultPoint *)local_378);
    from = &local_238;
    TransitionsBetween((ResultPointsAndTransitions *)(local_138 + 0x18),image,(ResultPoint *)from,
                       (ResultPoint *)(local_398 + 0x10));
    pEVar32 = (EdgeTracer *)local_378;
    TransitionsBetween((ResultPointsAndTransitions *)local_108,image,(ResultPoint *)pEVar32,
                       (ResultPoint *)local_398);
    TransitionsBetween(&local_f0,image,(ResultPoint *)(local_398 + 0x10),(ResultPoint *)local_398);
    __n = 0x18;
    pRVar39 = (ResultPointsAndTransitions *)local_138;
    do {
      pRVar45 = (ResultPointsAndTransitions *)(local_138 + __n);
      iVar37 = pRVar39[1].transitions;
      if (iVar37 < (int)local_138._16_4_) {
        local_2a8.a13 = (value_t)*(RegressionLine **)(local_138 + __n + 0x10);
        local_2a8.a11 = (value_t)pRVar45->from;
        local_2a8.a12 = *(value_t *)(local_138 + __n + 8);
        memmove((void *)((long)pRVar39 + (0x30 - __n)),(ResultPointsAndTransitions *)local_138,__n);
        local_138._0_8_ = local_2a8.a11;
        local_138._8_8_ = local_2a8.a12;
        local_138._16_8_ = local_2a8.a13;
      }
      else {
        local_2a8.a11 = (value_t)pRVar45->from;
        local_2a8.a12 = *(value_t *)(local_138 + __n + 8);
        uVar33 = *(undefined4 *)&pRVar39[1].field_0x14;
        iVar22 = pRVar39->transitions;
        pRVar39 = pRVar45;
        while (iVar37 < iVar22) {
          uVar14 = *(undefined4 *)&pRVar39[-1].field_0x14;
          pRVar39->transitions = pRVar39[-1].transitions;
          *(undefined4 *)&pRVar39->field_0x14 = uVar14;
          pRVar10 = pRVar39[-1].to;
          pRVar39->from = pRVar39[-1].from;
          pRVar39->to = pRVar10;
          iVar22 = pRVar39[-2].transitions;
          pRVar39 = pRVar39 + -1;
        }
        pRVar39->from = (ResultPoint *)local_2a8.a11;
        pRVar39->to = (ResultPoint *)local_2a8.a12;
        pRVar39->transitions = iVar37;
        *(undefined4 *)&pRVar39->field_0x14 = uVar33;
      }
      __n = __n + 0x18;
      pRVar39 = pRVar45;
    } while (__n != 0x60);
    if (local_110 < 3) {
      p_Var2 = (_Rb_tree_node_base *)(local_358 + 8);
      local_358._8_8_ = local_358._8_8_ & 0xffffffff00000000;
      local_348 = (_Rb_tree_node_base *)0x0;
      PStack_340.y = (double)p_Var2;
      PStack_340.x = (double)p_Var2;
      pBStack_330 = (ByteMatrix *)0x0;
      pmVar28 = std::
                map<const_ZXing::ResultPoint_*,_int,_std::less<const_ZXing::ResultPoint_*>,_std::allocator<std::pair<const_ZXing::ResultPoint_*const,_int>_>_>
                ::operator[]((map<const_ZXing::ResultPoint_*,_int,_std::less<const_ZXing::ResultPoint_*>,_std::allocator<std::pair<const_ZXing::ResultPoint_*const,_int>_>_>
                              *)local_358,(key_type *)local_138);
      *pmVar28 = *pmVar28 + 1;
      pmVar28 = std::
                map<const_ZXing::ResultPoint_*,_int,_std::less<const_ZXing::ResultPoint_*>,_std::allocator<std::pair<const_ZXing::ResultPoint_*const,_int>_>_>
                ::operator[]((map<const_ZXing::ResultPoint_*,_int,_std::less<const_ZXing::ResultPoint_*>,_std::allocator<std::pair<const_ZXing::ResultPoint_*const,_int>_>_>
                              *)local_358,(key_type *)(local_138 + 8));
      *pmVar28 = *pmVar28 + 1;
      pmVar28 = std::
                map<const_ZXing::ResultPoint_*,_int,_std::less<const_ZXing::ResultPoint_*>,_std::allocator<std::pair<const_ZXing::ResultPoint_*const,_int>_>_>
                ::operator[]((map<const_ZXing::ResultPoint_*,_int,_std::less<const_ZXing::ResultPoint_*>,_std::allocator<std::pair<const_ZXing::ResultPoint_*const,_int>_>_>
                              *)local_358,(key_type *)(local_138 + 0x18));
      *pmVar28 = *pmVar28 + 1;
      pmVar28 = std::
                map<const_ZXing::ResultPoint_*,_int,_std::less<const_ZXing::ResultPoint_*>,_std::allocator<std::pair<const_ZXing::ResultPoint_*const,_int>_>_>
                ::operator[]((map<const_ZXing::ResultPoint_*,_int,_std::less<const_ZXing::ResultPoint_*>,_std::allocator<std::pair<const_ZXing::ResultPoint_*const,_int>_>_>
                              *)local_358,&pRStack_118);
      *pmVar28 = *pmVar28 + 1;
      pPVar40 = (PointF *)0x0;
      local_378._24_8_ = 0.0;
      local_3a8 = (PointF *)0x0;
      pPVar47 = (PointF *)0x0;
      pPVar42 = (PointF *)0x0;
      if ((_Rb_tree_node_base *)PStack_340.x != p_Var2) {
        pPVar42 = (PointF *)0x0;
        pPVar40 = (PointF *)0x0;
        p_Var29 = (_Rb_tree_node_base *)PStack_340.x;
        pPVar41 = (PointF *)0x0;
        do {
          if (*(int *)&p_Var29[1]._M_parent == 2) {
            pPVar40 = *(PointF **)(p_Var29 + 1);
            pPVar47 = pPVar41;
          }
          else {
            pPVar47 = *(PointF **)(p_Var29 + 1);
            if (pPVar42 == (PointF *)0x0) {
              pPVar42 = pPVar47;
              pPVar47 = pPVar41;
            }
          }
          p_Var29 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var29);
          pPVar41 = pPVar47;
        } while (p_Var29 != p_Var2);
      }
      local_3a8 = pPVar47;
      local_378._24_8_ = pPVar40;
      if (((pPVar42 == (PointF *)0x0) || (pPVar40 == (PointF *)0x0)) || (pPVar47 == (PointF *)0x0))
      {
LAB_00152c28:
        local_308._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = 0;
        local_308._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = 0;
        local_308._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x = 0;
        local_308._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y = 0;
        local_308._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = 0;
        local_308._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = 0;
        local_308._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = 0;
        local_308._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = 0;
        local_308._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_308._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_308._bits._width = 0;
        local_308._bits._height = 0;
        local_308._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      }
      else {
        dVar57 = ((PointF *)&pPVar42->x)->x - pPVar40->x;
        dVar49 = pPVar42->y - pPVar40->y;
        dVar57 = dVar57 * dVar57 + dVar49 * dVar49;
        if (dVar57 < 0.0) {
          dVar57 = sqrt(dVar57);
        }
        else {
          dVar57 = SQRT(dVar57);
        }
        dVar49 = pPVar40->x - pPVar47->x;
        dVar59 = pPVar40->y - pPVar47->y;
        dVar49 = dVar49 * dVar49 + dVar59 * dVar59;
        if (dVar49 < 0.0) {
          p_Var69 = (_Base_ptr)sqrt(dVar49);
          p_Var73 = extraout_XMM0_Qb_00;
        }
        else {
          p_Var69 = (_Base_ptr)SQRT(dVar49);
          p_Var73 = (_Base_ptr)0x0;
        }
        dVar49 = ((PointF *)&pPVar42->x)->x - pPVar47->x;
        dVar59 = pPVar42->y - pPVar47->y;
        dVar49 = dVar49 * dVar49 + dVar59 * dVar59;
        if (dVar49 < 0.0) {
          local_2c8 = p_Var69;
          p_Stack_2c0 = p_Var73;
          dVar49 = sqrt(dVar49);
          p_Var69 = local_2c8;
        }
        else {
          dVar49 = SQRT(dVar49);
        }
        if (((double)p_Var69 < dVar57) || ((double)p_Var69 < dVar49)) {
          ppPVar30 = &local_3a8;
          pPVar41 = pPVar42;
          if (dVar49 < (double)p_Var69 || dVar49 < dVar57) {
            ppPVar30 = (PointF **)(local_378 + 0x18);
            pPVar40 = pPVar47;
          }
        }
        else {
          ppPVar30 = &local_3a8;
          pPVar41 = pPVar40;
          pPVar40 = pPVar42;
        }
        pPVar47 = *ppPVar30;
        fVar58 = (float)((PointF *)&pPVar40->x)->x;
        local_3a8 = pPVar47;
        if (((float)pPVar41->y - (float)pPVar40->y) * ((float)pPVar47->x - fVar58) -
            ((float)((PointF *)&pPVar41->x)->x - fVar58) * ((float)pPVar47->y - (float)pPVar40->y) <
            0.0) {
          local_3a8 = pPVar41;
          pPVar41 = pPVar47;
        }
        local_378._24_8_ = pPVar40;
        p_Var29 = p_Var2;
        for (p_Var73 = local_348; p_Var73 != (_Rb_tree_node_base *)0x0;
            p_Var73 = (&p_Var73->_M_left)[*(EdgeTracer **)(p_Var73 + 1) < from]) {
          if (*(EdgeTracer **)(p_Var73 + 1) >= from) {
            p_Var29 = p_Var73;
          }
        }
        p_Var31 = p_Var2;
        if ((p_Var29 != p_Var2) && (p_Var31 = p_Var29, from < *(EdgeTracer **)(p_Var29 + 1))) {
          p_Var31 = p_Var2;
        }
        p_Var29 = p_Var2;
        p_Var13 = local_348;
        if (p_Var31 != p_Var2) {
          for (; p_Var13 != (_Rb_tree_node_base *)0x0;
              p_Var13 = (&p_Var13->_M_left)[*(EdgeTracer **)(p_Var13 + 1) < pEVar32]) {
            if (*(EdgeTracer **)(p_Var13 + 1) >= pEVar32) {
              p_Var29 = p_Var13;
            }
          }
          p_Var31 = p_Var2;
          if ((p_Var29 != p_Var2) && (p_Var31 = p_Var29, pEVar32 < *(EdgeTracer **)(p_Var29 + 1))) {
            p_Var31 = p_Var2;
          }
          from = pEVar32;
          if (p_Var31 != p_Var2) {
            pEVar32 = (EdgeTracer *)(local_398 + 0x10);
            p_Var29 = p_Var2;
            for (p_Var73 = local_348; p_Var73 != (_Rb_tree_node_base *)0x0;
                p_Var73 = (&p_Var73->_M_left)[*(EdgeTracer **)(p_Var73 + 1) < pEVar32]) {
              if (*(EdgeTracer **)(p_Var73 + 1) >= pEVar32) {
                p_Var29 = p_Var73;
              }
            }
            p_Var31 = p_Var2;
            if ((p_Var29 != p_Var2) && (p_Var31 = p_Var29, pEVar32 < *(EdgeTracer **)(p_Var29 + 1)))
            {
              p_Var31 = p_Var2;
            }
            from = (EdgeTracer *)local_398;
            if (p_Var31 == p_Var2) {
              from = pEVar32;
            }
          }
        }
        TransitionsBetween((ResultPointsAndTransitions *)&local_2a8,image,(ResultPoint *)local_3a8,
                           (ResultPoint *)from);
        uVar43 = local_2a8.a13._0_4_;
        TransitionsBetween((ResultPointsAndTransitions *)&local_2a8,image,(ResultPoint *)pPVar41,
                           (ResultPoint *)from);
        uVar16 = local_378._24_8_;
        pPVar40 = local_3a8;
        if ((uVar43 - 0x8f) + (uVar43 & 1) < 0xffffff79) goto LAB_00152c28;
        if ((local_2a8.a13._0_4_ - 0x8f) + (local_2a8.a13._0_4_ & 1) < 0xffffff77)
        goto LAB_00152c28;
        iVar22 = uVar43 + (uVar43 & 1) + 2;
        iVar37 = (local_2a8.a13._0_4_ & 1) + 2 + local_2a8.a13._0_4_;
        local_3c8 = (PointF)ZEXT816(0);
        if ((SBORROW4(iVar22 * 4,iVar37 * 7) == iVar22 * 4 + iVar37 * -7 < 0) ||
           (SBORROW4(iVar37 * 4,iVar22 * 7) == iVar37 * 4 + iVar22 * -7 < 0)) {
          dVar57 = *(double *)local_378._24_8_ - ((PointF *)&pPVar41->x)->x;
          dVar49 = *(double *)(local_378._24_8_ + 8) - pPVar41->y;
          dVar57 = dVar57 * dVar57 + dVar49 * dVar49;
          if (dVar57 < 0.0) {
            dVar57 = sqrt(dVar57);
          }
          else {
            dVar57 = SQRT(dVar57);
          }
          dVar57 = round(dVar57);
          dVar49 = pPVar40->x - (double)(from->super_BitMatrixCursorF).img;
          dVar59 = pPVar40->y - (from->super_BitMatrixCursorF).p.x;
          dVar49 = dVar49 * dVar49 + dVar59 * dVar59;
          if (dVar49 < 0.0) {
            dVar49 = sqrt(dVar49);
          }
          else {
            dVar49 = SQRT(dVar49);
          }
          dVar49 = round(dVar49);
          auVar55._0_4_ = (float)dVar49;
          fVar58 = (float)(double)(from->super_BitMatrixCursorF).img;
          fVar64 = (float)(from->super_BitMatrixCursorF).p.x;
          auVar77._0_4_ = fVar58 - (float)pPVar40->x;
          auVar77._4_4_ = fVar64 - (float)pPVar40->y;
          auVar77._8_8_ = 0;
          auVar55._4_4_ = auVar55._0_4_;
          auVar55._8_4_ = auVar55._0_4_;
          auVar55._12_4_ = auVar55._0_4_;
          auVar63 = divps(auVar77,auVar55);
          local_1f8.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].y =
               (double)(((float)dVar57 / (float)iVar22) * auVar63._4_4_ + fVar64);
          local_1f8.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].x =
               (double)(((float)dVar57 / (float)iVar22) * auVar63._0_4_ + fVar58);
          dVar57 = *(double *)uVar16 - pPVar40->x;
          dVar49 = *(double *)(uVar16 + 8) - pPVar40->y;
          dVar57 = dVar57 * dVar57 + dVar49 * dVar49;
          if (dVar57 < 0.0) {
            dVar57 = sqrt(dVar57);
          }
          else {
            dVar57 = SQRT(dVar57);
          }
          dVar57 = round(dVar57);
          dVar49 = ((PointF *)&pPVar41->x)->x - (double)(from->super_BitMatrixCursorF).img;
          dVar59 = pPVar41->y - (from->super_BitMatrixCursorF).p.x;
          dVar49 = dVar49 * dVar49 + dVar59 * dVar59;
          if (dVar49 < 0.0) {
            dVar49 = sqrt(dVar49);
          }
          else {
            dVar49 = SQRT(dVar49);
          }
          dVar49 = round(dVar49);
          auVar56._0_4_ = (float)dVar49;
          fVar64 = (float)(double)(from->super_BitMatrixCursorF).img;
          fVar65 = (float)(from->super_BitMatrixCursorF).p.x;
          auVar76._0_4_ = fVar64 - (float)((PointF *)&pPVar41->x)->x;
          auVar76._4_4_ = fVar65 - (float)pPVar41->y;
          auVar76._8_8_ = 0;
          auVar56._4_4_ = auVar56._0_4_;
          auVar56._8_4_ = auVar56._0_4_;
          auVar56._12_4_ = auVar56._0_4_;
          auVar63 = divps(auVar76,auVar56);
          fVar64 = ((float)dVar57 / (float)iVar37) * auVar63._0_4_ + fVar64;
          fVar65 = ((float)dVar57 / (float)iVar37) * auVar63._4_4_ + fVar65;
          local_178.super_BitMatrixCursorF.img = (BitMatrix *)(double)fVar64;
          local_178.super_BitMatrixCursorF.p.x = (double)(double)fVar65;
          fVar58 = (float)image->_width;
          if (((float)local_1f8.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].x < 0.0) ||
             (fVar58 <= (float)local_1f8.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].x)) {
LAB_00152f53:
            if ((((0.0 <= fVar64) && (fVar64 < fVar58)) && (0.0 < fVar65)) &&
               (fVar65 < (float)image->_height)) {
              pEVar32 = &local_178;
              goto LAB_00152f7d;
            }
            local_3c8.x = (double)(from->super_BitMatrixCursorF).img;
            local_3c8.y = (from->super_BitMatrixCursorF).p.x;
          }
          else {
            if (((float)local_1f8.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].y <= 0.0) ||
               (fVar68 = (float)image->_height,
               fVar68 <= (float)local_1f8.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].y))
            goto LAB_00152f53;
            if (fVar64 < 0.0) {
              pEVar32 = (EdgeTracer *)&local_1f8;
            }
            else {
              pEVar32 = (EdgeTracer *)&local_1f8;
              if (((fVar64 < fVar58) && (0.0 < fVar65)) && (fVar65 < fVar68)) {
                TransitionsBetween((ResultPointsAndTransitions *)&local_2a8,image,
                                   (ResultPoint *)pPVar40,(ResultPoint *)&local_1f8);
                iVar24 = local_2a8.a13._0_4_;
                TransitionsBetween((ResultPointsAndTransitions *)&local_1b8,image,
                                   (ResultPoint *)pPVar41,(ResultPoint *)&local_1f8);
                iVar24 = iVar22 - iVar24;
                iVar23 = -iVar24;
                if (0 < iVar24) {
                  iVar23 = iVar24;
                }
                iVar25 = iVar37 - local_1b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].x.
                                  _0_4_;
                iVar24 = -iVar25;
                if (0 < iVar25) {
                  iVar24 = iVar25;
                }
                TransitionsBetween((ResultPointsAndTransitions *)&local_2a8,image,
                                   (ResultPoint *)pPVar40,(ResultPoint *)&local_178);
                iVar25 = local_2a8.a13._0_4_;
                TransitionsBetween((ResultPointsAndTransitions *)&local_1b8,image,
                                   (ResultPoint *)pPVar41,(ResultPoint *)&local_178);
                iVar22 = iVar22 - iVar25;
                iVar25 = -iVar22;
                if (0 < iVar22) {
                  iVar25 = iVar22;
                }
                iVar37 = iVar37 - local_1b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].x.
                                  _0_4_;
                iVar22 = -iVar37;
                if (0 < iVar37) {
                  iVar22 = iVar37;
                }
                pEVar32 = (EdgeTracer *)&local_1f8;
                if ((uint)(iVar22 + iVar25) < (uint)(iVar24 + iVar23)) {
                  pEVar32 = &local_178;
                }
              }
            }
LAB_00152f7d:
            local_3c8.x = ((array<ZXing::PointT<double>,_4UL> *)&pEVar32->super_BitMatrixCursorF)->
                          _M_elems[0].x;
            local_3c8.y = ((array<ZXing::PointT<double>,_4UL> *)&pEVar32->super_BitMatrixCursorF)->
                          _M_elems[0].y;
          }
          TransitionsBetween((ResultPointsAndTransitions *)&local_2a8,image,(ResultPoint *)local_3a8
                             ,(ResultPoint *)&local_3c8);
          uVar43 = local_2a8.a13._0_4_;
          TransitionsBetween((ResultPointsAndTransitions *)&local_2a8,image,(ResultPoint *)pPVar41,
                             (ResultPoint *)&local_3c8);
          iVar22 = (uVar43 & 1) + uVar43;
          iVar37 = (local_2a8.a13._0_4_ & 1) + local_2a8.a13._0_4_;
        }
        else {
          if (iVar22 < iVar37) {
            iVar37 = iVar22;
          }
          local_3c8 = (PointF)CorrectTopRight(image,(ResultPoint *)local_378._24_8_,
                                              (ResultPoint *)pPVar41,(ResultPoint *)local_3a8,
                                              (ResultPoint *)from,iVar37);
          TransitionsBetween((ResultPointsAndTransitions *)&local_2a8,image,(ResultPoint *)local_3a8
                             ,(ResultPoint *)&local_3c8);
          TransitionsBetween((ResultPointsAndTransitions *)&local_1b8,image,(ResultPoint *)pPVar41,
                             (ResultPoint *)&local_3c8);
          if ((int)local_1b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].x._0_4_ <
              (int)local_2a8.a13._0_4_) {
            local_1b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].x._0_4_ =
                 local_2a8.a13._0_4_;
          }
          iVar22 = (local_1b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].x._0_4_ &
                   0xfffffffe) + 2;
          iVar37 = iVar22;
        }
        local_1b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].x = (double)iVar22 + -0.5;
        local_1b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[2].y = (double)iVar37 + -0.5;
        local_1b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].x = 0.5;
        local_1b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].y = 0.5;
        local_1b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].y = 0.5;
        local_1b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[3].y =
             local_1b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[2].y;
        local_1b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[3].x = 0.5;
        local_1f8.super_array<ZXing::PointT<double>,_4UL>._M_elems[0] = *local_3a8;
        local_1f8.super_array<ZXing::PointT<double>,_4UL>._M_elems[2].x = ((PointF *)&pPVar41->x)->x
        ;
        local_1f8.super_array<ZXing::PointT<double>,_4UL>._M_elems[2].y = pPVar41->y;
        local_1f8.super_array<ZXing::PointT<double>,_4UL>._M_elems[3].x =
             ((PointF *)local_378._24_8_)->x;
        local_1f8.super_array<ZXing::PointT<double>,_4UL>._M_elems[3].y =
             *(double *)(local_378._24_8_ + 8);
        local_1f8.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].x = local_3c8.x;
        local_1f8.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].y = local_3c8.y;
        local_1b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[2].x =
             local_1b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].x;
        PerspectiveTransform::PerspectiveTransform(&local_2a8,&local_1b8,&local_1f8);
        SampleGrid(&local_308,image,iVar22,iVar37,&local_2a8);
      }
      std::
      _Rb_tree<const_ZXing::ResultPoint_*,_std::pair<const_ZXing::ResultPoint_*const,_int>,_std::_Select1st<std::pair<const_ZXing::ResultPoint_*const,_int>_>,_std::less<const_ZXing::ResultPoint_*>,_std::allocator<std::pair<const_ZXing::ResultPoint_*const,_int>_>_>
      ::~_Rb_tree((_Rb_tree<const_ZXing::ResultPoint_*,_std::pair<const_ZXing::ResultPoint_*const,_int>,_std::_Select1st<std::pair<const_ZXing::ResultPoint_*const,_int>_>,_std::less<const_ZXing::ResultPoint_*>,_std::allocator<std::pair<const_ZXing::ResultPoint_*const,_int>_>_>
                   *)local_358);
      goto LAB_00153098;
    }
  }
  local_308._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = 0;
  local_308._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = 0;
  local_308._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x = 0;
  local_308._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y = 0;
  local_308._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = 0;
  local_308._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = 0;
  local_308._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = 0;
  local_308._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = 0;
  local_308._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_308._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_308._bits._width = 0;
  local_308._bits._height = 0;
  local_308._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
LAB_00153098:
  pDVar15 = local_3b0;
  (local_3b0->_bits)._width = local_308._bits._width;
  (local_3b0->_bits)._height = local_308._bits._height;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (local_2b0,&local_308._bits._bits);
  (pDVar15->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2] =
       local_308._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[2];
  (pDVar15->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3] =
       local_308._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[3];
  (pDVar15->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0] =
       local_308._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[0];
  (pDVar15->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1] =
       local_308._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[1];
  if (local_308._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_308._bits._bits.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_308._bits._bits.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_308._bits._bits.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return local_3b0;
}

Assistant:

DetectorResults Detect(const BitMatrix& image, bool tryHarder, bool tryRotate, bool isPure)
{
#ifdef __cpp_impl_coroutine
	// First try the very fast DetectPure() path. Also because DetectNew() generally fails with pure module size 1 symbols
	// TODO: implement a tryRotate version of DetectPure, see #590.
	if (auto r = DetectPure(image); r.isValid())
		co_yield std::move(r);
	else if (!isPure) { // If r.isValid() then there is no point in looking for more (no-pure) symbols
		bool found = false;
		for (auto&& r : DetectNew(image, tryHarder, tryRotate)) {
			found = true;
			co_yield std::move(r);
		}
		if (!found && tryHarder) {
			if (auto r = DetectOld(image); r.isValid())
				co_yield std::move(r);
		}
	}
#else
	auto result = DetectPure(image);
	if (!result.isValid() && !isPure)
		result = DetectNew(image, tryHarder, tryRotate);
	if (!result.isValid() && tryHarder && !isPure)
		result = DetectOld(image);
	return result;
#endif
}